

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::ComputeV2
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,
          TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *v2)

{
  bool bVar1;
  reference this_00;
  long in_RDI;
  TPZFNMatrix<100,_long_double> v2_local;
  TPZFNMatrix<100,_long_double> Residual_local;
  int isub;
  const_iterator it;
  list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
  *in_stack_fffffffffffff1c8;
  TPZDohrAssembly<long_double> *in_stack_fffffffffffff1d0;
  TPZFNMatrix<100,_long_double> *in_stack_fffffffffffff1e0;
  TPZFMatrix<long_double> *in_stack_fffffffffffff1f8;
  TPZFMatrix<long_double> *in_stack_fffffffffffff200;
  int in_stack_fffffffffffff20c;
  TPZDohrAssembly<long_double> *in_stack_fffffffffffff210;
  TPZFMatrix<long_double> *in_stack_fffffffffffff6e0;
  TPZFMatrix<long_double> *in_stack_fffffffffffff6e8;
  TPZDohrSubstruct<long_double> *in_stack_fffffffffffff6f0;
  _Self local_38;
  _List_node_base *local_30;
  int local_24;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_> local_20 [4];
  
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::_List_const_iterator
            (local_20);
  local_24 = 0;
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
             ::begin(in_stack_fffffffffffff1c8);
  local_20[0]._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
         ::end(in_stack_fffffffffffff1c8);
    bVar1 = std::operator!=(local_20,&local_38);
    if (!bVar1) break;
    TPZFNMatrix<100,_long_double>::TPZFNMatrix(in_stack_fffffffffffff1e0);
    TPZFNMatrix<100,_long_double>::TPZFNMatrix(in_stack_fffffffffffff1e0);
    in_stack_fffffffffffff1e0 =
         (TPZFNMatrix<100,_long_double> *)
         TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)(in_RDI + 0x50));
    TPZDohrAssembly<long_double>::Extract
              (in_stack_fffffffffffff210,in_stack_fffffffffffff20c,in_stack_fffffffffffff200,
               in_stack_fffffffffffff1f8);
    this_00 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::operator*
                        ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_> *)
                         in_stack_fffffffffffff1d0);
    TPZAutoPointer<TPZDohrSubstruct<long_double>_>::operator->(this_00);
    TPZDohrSubstruct<long_double>::Contribute_v2_local
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    in_stack_fffffffffffff1d0 =
         TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)(in_RDI + 0x50));
    TPZDohrAssembly<long_double>::Assemble
              (in_stack_fffffffffffff210,in_stack_fffffffffffff20c,in_stack_fffffffffffff200,
               in_stack_fffffffffffff1f8);
    TPZFNMatrix<100,_long_double>::~TPZFNMatrix((TPZFNMatrix<100,_long_double> *)0x1f7ac23);
    TPZFNMatrix<100,_long_double>::~TPZFNMatrix((TPZFNMatrix<100,_long_double> *)0x1f7ac30);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::operator++
              (local_20,0);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}